

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O3

wchar_t do_sftp(wchar_t mode,wchar_t modeflags,char *batchfile)

{
  int iVar1;
  FILE *__stream;
  sftp_command *psVar2;
  
  if (mode == L'\0') {
    do {
      psVar2 = sftp_getcmd((FILE *)0x0,L'\0',L'\0');
      if (psVar2 == (sftp_command *)0x0) {
        return L'\0';
      }
      iVar1 = (*psVar2->obey)(psVar2);
      sftp_cmd_free(psVar2);
    } while (-1 < iVar1);
  }
  else {
    __stream = fopen(batchfile,"r");
    if (__stream == (FILE *)0x0) {
      printf("Fatal: unable to open %s\n",batchfile);
      return L'\x01';
    }
    psVar2 = sftp_getcmd((FILE *)__stream,mode,modeflags);
    if (psVar2 == (sftp_command *)0x0) {
LAB_00111fc6:
      iVar1 = 0;
    }
    else {
      do {
        iVar1 = (*psVar2->obey)(psVar2);
        sftp_cmd_free(psVar2);
        if (iVar1 < 0) break;
        if (iVar1 == 0 && (modeflags & 2U) == 0) goto LAB_00111fc6;
        psVar2 = sftp_getcmd((FILE *)__stream,mode,modeflags);
      } while (psVar2 != (sftp_command *)0x0);
    }
    fclose(__stream);
    if (iVar1 == 0 && (modeflags & 2U) == 0) {
      return L'\x02';
    }
  }
  return L'\0';
}

Assistant:

int do_sftp(int mode, int modeflags, char *batchfile)
{
    FILE *fp;
    int ret;

    /*
     * Batch mode?
     */
    if (mode == 0) {

        /* ------------------------------------------------------------------
         * Now we're ready to do Real Stuff.
         */
        while (1) {
            struct sftp_command *cmd;
            cmd = sftp_getcmd(NULL, 0, 0);
            if (!cmd)
                break;
            ret = cmd->obey(cmd);
            sftp_cmd_free(cmd);
            if (ret < 0)
                break;
        }
    } else {
        fp = fopen(batchfile, "r");
        if (!fp) {
            printf("Fatal: unable to open %s\n", batchfile);
            return 1;
        }
        ret = 0;
        while (1) {
            struct sftp_command *cmd;
            cmd = sftp_getcmd(fp, mode, modeflags);
            if (!cmd)
                break;
            ret = cmd->obey(cmd);
            sftp_cmd_free(cmd);
            if (ret < 0)
                break;
            if (ret == 0) {
                if (!(modeflags & 2))
                    break;
            }
        }
        fclose(fp);
        /*
         * In batch mode, and if exit on command failure is enabled,
         * any command failure causes the whole of PSFTP to fail.
         */
        if (ret == 0 && !(modeflags & 2)) return 2;
    }
    return 0;
}